

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O2

void aom_smooth_h_predictor_64x64_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  ulong uVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [16];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  int left_offset;
  ulong uVar9;
  uint uVar10;
  short sVar11;
  short sVar13;
  undefined1 auVar12 [16];
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  short sVar30;
  ushort uVar31;
  ushort uVar32;
  short sVar34;
  ushort uVar35;
  ushort uVar36;
  short sVar37;
  ushort uVar38;
  ushort uVar39;
  short sVar40;
  ushort uVar41;
  ushort uVar42;
  short sVar43;
  ushort uVar44;
  ushort uVar45;
  short sVar46;
  ushort uVar47;
  ushort uVar48;
  short sVar49;
  ushort uVar50;
  ushort uVar51;
  undefined1 auVar33 [16];
  short sVar52;
  ushort uVar53;
  ushort uVar54;
  undefined1 auVar55 [16];
  
  auVar12 = pshuflw(ZEXT116(top_row[0x3f]),ZEXT116(top_row[0x3f]),0);
  sVar11 = auVar12._0_2_;
  sVar13 = auVar12._2_2_;
  for (uVar9 = 0; uVar9 < 0x40; uVar9 = uVar9 + 8) {
    uVar1 = *(ulong *)(left_column + uVar9);
    auVar2._8_6_ = 0;
    auVar2._0_8_ = uVar1;
    auVar2[0xe] = (char)(uVar1 >> 0x38);
    auVar4._8_4_ = 0;
    auVar4._0_8_ = uVar1;
    auVar4[0xc] = (char)(uVar1 >> 0x30);
    auVar4._13_2_ = auVar2._13_2_;
    auVar5._8_4_ = 0;
    auVar5._0_8_ = uVar1;
    auVar5._12_3_ = auVar4._12_3_;
    auVar6._8_2_ = 0;
    auVar6._0_8_ = uVar1;
    auVar6[10] = (char)(uVar1 >> 0x28);
    auVar6._11_4_ = auVar5._11_4_;
    auVar7._8_2_ = 0;
    auVar7._0_8_ = uVar1;
    auVar7._10_5_ = auVar6._10_5_;
    auVar8[8] = (char)(uVar1 >> 0x20);
    auVar8._0_8_ = uVar1;
    auVar8._9_6_ = auVar7._9_6_;
    auVar3._1_9_ = SUB169(ZEXT716(auVar8._8_7_) << 0x40,7);
    auVar3[0] = (char)(uVar1 >> 0x18);
    auVar3._10_6_ = 0;
    auVar12._1_11_ = SUB1611(auVar3 << 0x30,5);
    auVar12[0] = (char)(uVar1 >> 0x10);
    auVar12._12_4_ = 0;
    auVar55._3_13_ = SUB1613(auVar12 << 0x20,3);
    auVar55[2] = (char)(uVar1 >> 8);
    auVar55[0] = (byte)uVar1;
    auVar55[1] = 0;
    for (uVar10 = 0x1000100; uVar10 < 0xf0e0f0f; uVar10 = uVar10 + 0x2020202) {
      auVar33._4_4_ = uVar10;
      auVar33._0_4_ = uVar10;
      auVar33._8_4_ = uVar10;
      auVar33._12_4_ = uVar10;
      auVar12 = pshufb(auVar55,auVar33);
      sVar30 = auVar12._0_2_;
      sVar34 = auVar12._2_2_;
      sVar37 = auVar12._4_2_;
      sVar40 = auVar12._6_2_;
      sVar43 = auVar12._8_2_;
      sVar46 = auVar12._10_2_;
      sVar49 = auVar12._12_2_;
      sVar52 = auVar12._14_2_;
      uVar31 = sVar30 * 0xff + sVar11 + 0x80;
      uVar35 = sVar34 * 0xf8 + sVar13 * 8 + 0x80;
      uVar38 = sVar37 * 0xf0 + sVar11 * 0x10 + 0x80;
      uVar41 = sVar40 * 0xe9 + sVar13 * 0x17 + 0x80;
      uVar44 = sVar43 * 0xe1 + sVar11 * 0x1f + 0x80;
      uVar47 = sVar46 * 0xda + sVar13 * 0x26 + 0x80;
      uVar50 = sVar49 * 0xd2 + sVar11 * 0x2e + 0x80;
      uVar53 = sVar52 * 0xcb + sVar13 * 0x35 + 0x80;
      uVar14 = sVar30 * 0xc4 + sVar11 * 0x3c + 0x80;
      uVar16 = sVar34 * 0xbd + sVar13 * 0x43 + 0x80;
      uVar18 = sVar37 * 0xb6 + sVar11 * 0x4a + 0x80;
      uVar20 = sVar40 * 0xb0 + sVar13 * 0x50 + 0x80;
      uVar22 = sVar43 * 0xa9 + sVar11 * 0x57 + 0x80;
      uVar24 = sVar46 * 0xa3 + sVar13 * 0x5d + 0x80;
      uVar26 = sVar49 * 0x9c + sVar11 * 100 + 0x80;
      uVar28 = sVar52 * 0x96 + sVar13 * 0x6a + 0x80;
      uVar32 = uVar31 >> 8;
      uVar36 = uVar35 >> 8;
      uVar39 = uVar38 >> 8;
      uVar42 = uVar41 >> 8;
      uVar45 = uVar44 >> 8;
      uVar48 = uVar47 >> 8;
      uVar51 = uVar50 >> 8;
      uVar54 = uVar53 >> 8;
      uVar15 = uVar14 >> 8;
      uVar17 = uVar16 >> 8;
      uVar19 = uVar18 >> 8;
      uVar21 = uVar20 >> 8;
      uVar23 = uVar22 >> 8;
      uVar25 = uVar24 >> 8;
      uVar27 = uVar26 >> 8;
      uVar29 = uVar28 >> 8;
      *dst = (uVar32 != 0) * (uVar32 < 0x100) * (char)(uVar31 >> 8) - (0xff < uVar32);
      dst[1] = (uVar36 != 0) * (uVar36 < 0x100) * (char)(uVar35 >> 8) - (0xff < uVar36);
      dst[2] = (uVar39 != 0) * (uVar39 < 0x100) * (char)(uVar38 >> 8) - (0xff < uVar39);
      dst[3] = (uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8) - (0xff < uVar42);
      dst[4] = (uVar45 != 0) * (uVar45 < 0x100) * (char)(uVar44 >> 8) - (0xff < uVar45);
      dst[5] = (uVar48 != 0) * (uVar48 < 0x100) * (char)(uVar47 >> 8) - (0xff < uVar48);
      dst[6] = (uVar51 != 0) * (uVar51 < 0x100) * (char)(uVar50 >> 8) - (0xff < uVar51);
      dst[7] = (uVar54 != 0) * (uVar54 < 0x100) * (char)(uVar53 >> 8) - (0xff < uVar54);
      dst[8] = (uVar15 != 0) * (uVar15 < 0x100) * (char)(uVar14 >> 8) - (0xff < uVar15);
      dst[9] = (uVar17 != 0) * (uVar17 < 0x100) * (char)(uVar16 >> 8) - (0xff < uVar17);
      dst[10] = (uVar19 != 0) * (uVar19 < 0x100) * (char)(uVar18 >> 8) - (0xff < uVar19);
      dst[0xb] = (uVar21 != 0) * (uVar21 < 0x100) * (char)(uVar20 >> 8) - (0xff < uVar21);
      dst[0xc] = (uVar23 != 0) * (uVar23 < 0x100) * (char)(uVar22 >> 8) - (0xff < uVar23);
      dst[0xd] = (uVar25 != 0) * (uVar25 < 0x100) * (char)(uVar24 >> 8) - (0xff < uVar25);
      dst[0xe] = (uVar27 != 0) * (uVar27 < 0x100) * (char)(uVar26 >> 8) - (0xff < uVar27);
      dst[0xf] = (uVar29 != 0) * (uVar29 < 0x100) * (char)(uVar28 >> 8) - (0xff < uVar29);
      uVar14 = sVar30 * 0x90 + sVar11 * 0x70 + 0x80;
      uVar16 = sVar34 * 0x8a + sVar13 * 0x76 + 0x80;
      uVar18 = sVar37 * 0x85 + sVar11 * 0x7b + 0x80;
      uVar20 = sVar40 * 0x7f + sVar13 * 0x81 + 0x80;
      uVar22 = sVar43 * 0x79 + sVar11 * 0x87 + 0x80;
      uVar24 = sVar46 * 0x74 + sVar13 * 0x8c + 0x80;
      uVar26 = sVar49 * 0x6f + sVar11 * 0x91 + 0x80;
      uVar28 = sVar52 * 0x6a + sVar13 * 0x96 + 0x80;
      uVar31 = sVar30 * 0x65 + sVar11 * 0x9b + 0x80;
      uVar35 = sVar34 * 0x60 + sVar13 * 0xa0 + 0x80;
      uVar38 = sVar37 * 0x5b + sVar11 * 0xa5 + 0x80;
      uVar41 = sVar40 * 0x56 + sVar13 * 0xaa + 0x80;
      uVar44 = sVar43 * 0x52 + sVar11 * 0xae + 0x80;
      uVar47 = sVar46 * 0x4d + sVar13 * 0xb3 + 0x80;
      uVar50 = sVar49 * 0x49 + sVar11 * 0xb7 + 0x80;
      uVar53 = sVar52 * 0x45 + sVar13 * 0xbb + 0x80;
      uVar15 = uVar14 >> 8;
      uVar17 = uVar16 >> 8;
      uVar19 = uVar18 >> 8;
      uVar21 = uVar20 >> 8;
      uVar23 = uVar22 >> 8;
      uVar25 = uVar24 >> 8;
      uVar27 = uVar26 >> 8;
      uVar29 = uVar28 >> 8;
      uVar32 = uVar31 >> 8;
      uVar36 = uVar35 >> 8;
      uVar39 = uVar38 >> 8;
      uVar42 = uVar41 >> 8;
      uVar45 = uVar44 >> 8;
      uVar48 = uVar47 >> 8;
      uVar51 = uVar50 >> 8;
      uVar54 = uVar53 >> 8;
      dst[0x10] = (uVar15 != 0) * (uVar15 < 0x100) * (char)(uVar14 >> 8) - (0xff < uVar15);
      dst[0x11] = (uVar17 != 0) * (uVar17 < 0x100) * (char)(uVar16 >> 8) - (0xff < uVar17);
      dst[0x12] = (uVar19 != 0) * (uVar19 < 0x100) * (char)(uVar18 >> 8) - (0xff < uVar19);
      dst[0x13] = (uVar21 != 0) * (uVar21 < 0x100) * (char)(uVar20 >> 8) - (0xff < uVar21);
      dst[0x14] = (uVar23 != 0) * (uVar23 < 0x100) * (char)(uVar22 >> 8) - (0xff < uVar23);
      dst[0x15] = (uVar25 != 0) * (uVar25 < 0x100) * (char)(uVar24 >> 8) - (0xff < uVar25);
      dst[0x16] = (uVar27 != 0) * (uVar27 < 0x100) * (char)(uVar26 >> 8) - (0xff < uVar27);
      dst[0x17] = (uVar29 != 0) * (uVar29 < 0x100) * (char)(uVar28 >> 8) - (0xff < uVar29);
      dst[0x18] = (uVar32 != 0) * (uVar32 < 0x100) * (char)(uVar31 >> 8) - (0xff < uVar32);
      dst[0x19] = (uVar36 != 0) * (uVar36 < 0x100) * (char)(uVar35 >> 8) - (0xff < uVar36);
      dst[0x1a] = (uVar39 != 0) * (uVar39 < 0x100) * (char)(uVar38 >> 8) - (0xff < uVar39);
      dst[0x1b] = (uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8) - (0xff < uVar42);
      dst[0x1c] = (uVar45 != 0) * (uVar45 < 0x100) * (char)(uVar44 >> 8) - (0xff < uVar45);
      dst[0x1d] = (uVar48 != 0) * (uVar48 < 0x100) * (char)(uVar47 >> 8) - (0xff < uVar48);
      dst[0x1e] = (uVar51 != 0) * (uVar51 < 0x100) * (char)(uVar50 >> 8) - (0xff < uVar51);
      dst[0x1f] = (uVar54 != 0) * (uVar54 < 0x100) * (char)(uVar53 >> 8) - (0xff < uVar54);
      uVar14 = sVar30 * 0x41 + sVar11 * 0xbf + 0x80;
      uVar16 = sVar34 * 0x3d + sVar13 * 0xc3 + 0x80;
      uVar18 = sVar37 * 0x39 + sVar11 * 199 + 0x80;
      uVar20 = sVar40 * 0x36 + sVar13 * 0xca + 0x80;
      uVar22 = sVar43 * 0x32 + sVar11 * 0xce + 0x80;
      uVar24 = sVar46 * 0x2f + sVar13 * 0xd1 + 0x80;
      uVar26 = sVar49 * 0x2c + sVar11 * 0xd4 + 0x80;
      uVar28 = sVar52 * 0x29 + sVar13 * 0xd7 + 0x80;
      uVar31 = sVar30 * 0x26 + sVar11 * 0xda + 0x80;
      uVar35 = sVar34 * 0x23 + sVar13 * 0xdd + 0x80;
      uVar38 = sVar37 * 0x20 + sVar11 * 0xe0 + 0x80;
      uVar41 = sVar40 * 0x1d + sVar13 * 0xe3 + 0x80;
      uVar44 = sVar43 * 0x1b + sVar11 * 0xe5 + 0x80;
      uVar47 = sVar46 * 0x19 + sVar13 * 0xe7 + 0x80;
      uVar50 = sVar49 * 0x16 + sVar11 * 0xea + 0x80;
      uVar53 = sVar52 * 0x14 + sVar13 * 0xec + 0x80;
      uVar15 = uVar14 >> 8;
      uVar17 = uVar16 >> 8;
      uVar19 = uVar18 >> 8;
      uVar21 = uVar20 >> 8;
      uVar23 = uVar22 >> 8;
      uVar25 = uVar24 >> 8;
      uVar27 = uVar26 >> 8;
      uVar29 = uVar28 >> 8;
      uVar32 = uVar31 >> 8;
      uVar36 = uVar35 >> 8;
      uVar39 = uVar38 >> 8;
      uVar42 = uVar41 >> 8;
      uVar45 = uVar44 >> 8;
      uVar48 = uVar47 >> 8;
      uVar51 = uVar50 >> 8;
      uVar54 = uVar53 >> 8;
      dst[0x20] = (uVar15 != 0) * (uVar15 < 0x100) * (char)(uVar14 >> 8) - (0xff < uVar15);
      dst[0x21] = (uVar17 != 0) * (uVar17 < 0x100) * (char)(uVar16 >> 8) - (0xff < uVar17);
      dst[0x22] = (uVar19 != 0) * (uVar19 < 0x100) * (char)(uVar18 >> 8) - (0xff < uVar19);
      dst[0x23] = (uVar21 != 0) * (uVar21 < 0x100) * (char)(uVar20 >> 8) - (0xff < uVar21);
      dst[0x24] = (uVar23 != 0) * (uVar23 < 0x100) * (char)(uVar22 >> 8) - (0xff < uVar23);
      dst[0x25] = (uVar25 != 0) * (uVar25 < 0x100) * (char)(uVar24 >> 8) - (0xff < uVar25);
      dst[0x26] = (uVar27 != 0) * (uVar27 < 0x100) * (char)(uVar26 >> 8) - (0xff < uVar27);
      dst[0x27] = (uVar29 != 0) * (uVar29 < 0x100) * (char)(uVar28 >> 8) - (0xff < uVar29);
      dst[0x28] = (uVar32 != 0) * (uVar32 < 0x100) * (char)(uVar31 >> 8) - (0xff < uVar32);
      dst[0x29] = (uVar36 != 0) * (uVar36 < 0x100) * (char)(uVar35 >> 8) - (0xff < uVar36);
      dst[0x2a] = (uVar39 != 0) * (uVar39 < 0x100) * (char)(uVar38 >> 8) - (0xff < uVar39);
      dst[0x2b] = (uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8) - (0xff < uVar42);
      dst[0x2c] = (uVar45 != 0) * (uVar45 < 0x100) * (char)(uVar44 >> 8) - (0xff < uVar45);
      dst[0x2d] = (uVar48 != 0) * (uVar48 < 0x100) * (char)(uVar47 >> 8) - (0xff < uVar48);
      dst[0x2e] = (uVar51 != 0) * (uVar51 < 0x100) * (char)(uVar50 >> 8) - (0xff < uVar51);
      dst[0x2f] = (uVar54 != 0) * (uVar54 < 0x100) * (char)(uVar53 >> 8) - (0xff < uVar54);
      uVar14 = sVar30 * 0x12 + sVar11 * 0xee + 0x80;
      uVar16 = sVar34 * 0x10 + sVar13 * 0xf0 + 0x80;
      uVar18 = sVar37 * 0xf + sVar11 * 0xf1 + 0x80;
      uVar20 = sVar40 * 0xd + sVar13 * 0xf3 + 0x80;
      uVar22 = sVar43 * 0xc + sVar11 * 0xf4 + 0x80;
      uVar24 = sVar46 * 10 + sVar13 * 0xf6 + 0x80;
      uVar26 = sVar49 * 9 + sVar11 * 0xf7 + 0x80;
      uVar28 = sVar52 * 8 + sVar13 * 0xf8 + 0x80;
      uVar31 = sVar30 * 7 + sVar11 * 0xf9 + 0x80;
      uVar35 = sVar34 * 6 + sVar13 * 0xfa + 0x80;
      uVar38 = sVar37 * 6 + sVar11 * 0xfa + 0x80;
      uVar41 = sVar40 * 5 + sVar13 * 0xfb + 0x80;
      uVar44 = sVar43 * 5 + sVar11 * 0xfb + 0x80;
      uVar47 = sVar46 * 4 + sVar13 * 0xfc + 0x80;
      uVar50 = sVar49 * 4 + sVar11 * 0xfc + 0x80;
      uVar53 = sVar52 * 4 + sVar13 * 0xfc + 0x80;
      uVar15 = uVar14 >> 8;
      uVar17 = uVar16 >> 8;
      uVar19 = uVar18 >> 8;
      uVar21 = uVar20 >> 8;
      uVar23 = uVar22 >> 8;
      uVar25 = uVar24 >> 8;
      uVar27 = uVar26 >> 8;
      uVar29 = uVar28 >> 8;
      uVar32 = uVar31 >> 8;
      uVar36 = uVar35 >> 8;
      uVar39 = uVar38 >> 8;
      uVar42 = uVar41 >> 8;
      uVar45 = uVar44 >> 8;
      uVar48 = uVar47 >> 8;
      uVar51 = uVar50 >> 8;
      uVar54 = uVar53 >> 8;
      dst[0x30] = (uVar15 != 0) * (uVar15 < 0x100) * (char)(uVar14 >> 8) - (0xff < uVar15);
      dst[0x31] = (uVar17 != 0) * (uVar17 < 0x100) * (char)(uVar16 >> 8) - (0xff < uVar17);
      dst[0x32] = (uVar19 != 0) * (uVar19 < 0x100) * (char)(uVar18 >> 8) - (0xff < uVar19);
      dst[0x33] = (uVar21 != 0) * (uVar21 < 0x100) * (char)(uVar20 >> 8) - (0xff < uVar21);
      dst[0x34] = (uVar23 != 0) * (uVar23 < 0x100) * (char)(uVar22 >> 8) - (0xff < uVar23);
      dst[0x35] = (uVar25 != 0) * (uVar25 < 0x100) * (char)(uVar24 >> 8) - (0xff < uVar25);
      dst[0x36] = (uVar27 != 0) * (uVar27 < 0x100) * (char)(uVar26 >> 8) - (0xff < uVar27);
      dst[0x37] = (uVar29 != 0) * (uVar29 < 0x100) * (char)(uVar28 >> 8) - (0xff < uVar29);
      dst[0x38] = (uVar32 != 0) * (uVar32 < 0x100) * (char)(uVar31 >> 8) - (0xff < uVar32);
      dst[0x39] = (uVar36 != 0) * (uVar36 < 0x100) * (char)(uVar35 >> 8) - (0xff < uVar36);
      dst[0x3a] = (uVar39 != 0) * (uVar39 < 0x100) * (char)(uVar38 >> 8) - (0xff < uVar39);
      dst[0x3b] = (uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8) - (0xff < uVar42);
      dst[0x3c] = (uVar45 != 0) * (uVar45 < 0x100) * (char)(uVar44 >> 8) - (0xff < uVar45);
      dst[0x3d] = (uVar48 != 0) * (uVar48 < 0x100) * (char)(uVar47 >> 8) - (0xff < uVar48);
      dst[0x3e] = (uVar51 != 0) * (uVar51 < 0x100) * (char)(uVar50 >> 8) - (0xff < uVar51);
      dst[0x3f] = (uVar54 != 0) * (uVar54 < 0x100) * (char)(uVar53 >> 8) - (0xff < uVar54);
      dst = dst + stride;
    }
  }
  return;
}

Assistant:

void aom_smooth_h_predictor_64x64_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i top_right = _mm_set1_epi16(top_row[63]);
  const __m128i weights_lolo = LoadUnaligned16(smooth_weights + 60);
  const __m128i weights_lohi = LoadUnaligned16(smooth_weights + 76);
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i weights1 = cvtepu8_epi16(weights_lolo);
  const __m128i weights2 = cvtepu8_epi16(_mm_srli_si128(weights_lolo, 8));
  const __m128i weights3 = cvtepu8_epi16(weights_lohi);
  const __m128i weights4 = cvtepu8_epi16(_mm_srli_si128(weights_lohi, 8));
  const __m128i inverted_weights1 = _mm_sub_epi16(scale, weights1);
  const __m128i inverted_weights2 = _mm_sub_epi16(scale, weights2);
  const __m128i inverted_weights3 = _mm_sub_epi16(scale, weights3);
  const __m128i inverted_weights4 = _mm_sub_epi16(scale, weights4);
  const __m128i scaled_top_right1 =
      _mm_mullo_epi16(inverted_weights1, top_right);
  const __m128i scaled_top_right2 =
      _mm_mullo_epi16(inverted_weights2, top_right);
  const __m128i scaled_top_right3 =
      _mm_mullo_epi16(inverted_weights3, top_right);
  const __m128i scaled_top_right4 =
      _mm_mullo_epi16(inverted_weights4, top_right);
  const __m128i weights_hilo = LoadUnaligned16(smooth_weights + 92);
  const __m128i weights_hihi = LoadUnaligned16(smooth_weights + 108);
  const __m128i weights5 = cvtepu8_epi16(weights_hilo);
  const __m128i weights6 = cvtepu8_epi16(_mm_srli_si128(weights_hilo, 8));
  const __m128i weights7 = cvtepu8_epi16(weights_hihi);
  const __m128i weights8 = cvtepu8_epi16(_mm_srli_si128(weights_hihi, 8));
  const __m128i inverted_weights5 = _mm_sub_epi16(scale, weights5);
  const __m128i inverted_weights6 = _mm_sub_epi16(scale, weights6);
  const __m128i inverted_weights7 = _mm_sub_epi16(scale, weights7);
  const __m128i inverted_weights8 = _mm_sub_epi16(scale, weights8);
  const __m128i scaled_top_right5 =
      _mm_mullo_epi16(inverted_weights5, top_right);
  const __m128i scaled_top_right6 =
      _mm_mullo_epi16(inverted_weights6, top_right);
  const __m128i scaled_top_right7 =
      _mm_mullo_epi16(inverted_weights7, top_right);
  const __m128i scaled_top_right8 =
      _mm_mullo_epi16(inverted_weights8, top_right);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  for (int left_offset = 0; left_offset < 64; left_offset += 8) {
    const __m128i left = cvtepu8_epi16(LoadLo8(left_column + left_offset));
    for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
      const __m128i y_select = _mm_set1_epi32(y_mask);
      const __m128i left_y = _mm_shuffle_epi8(left, y_select);
      write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                     scaled_top_right1, scaled_top_right2,
                                     round);
      write_smooth_directional_sum16(dst + 16, left_y, left_y, weights3,
                                     weights4, scaled_top_right3,
                                     scaled_top_right4, round);
      write_smooth_directional_sum16(dst + 32, left_y, left_y, weights5,
                                     weights6, scaled_top_right5,
                                     scaled_top_right6, round);
      write_smooth_directional_sum16(dst + 48, left_y, left_y, weights7,
                                     weights8, scaled_top_right7,
                                     scaled_top_right8, round);
      dst += stride;
    }
  }
}